

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O2

bool __thiscall sf::priv::RenderTextureImplFBO::activate(RenderTextureImplFBO *this,bool active)

{
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *pmVar1;
  bool bVar2;
  Context *this_00;
  iterator iVar3;
  ostream *poVar4;
  undefined7 in_register_00000031;
  Lock lock;
  Uint64 contextId;
  
  if ((int)CONCAT71(in_register_00000031,active) == 0) {
    (*sf_glad_glBindFramebufferEXT)(0x8d40,0);
  }
  else {
    contextId = Context::getActiveContextId();
    if (contextId == 0) {
      this_00 = this->m_context;
      if (this_00 == (Context *)0x0) {
        this_00 = (Context *)operator_new(8);
        Context::Context(this_00);
        this->m_context = this_00;
      }
      Context::setActive(this_00,true);
      contextId = Context::getActiveContextId();
      if (contextId == 0) {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,
                                 "Impossible to activate render texture (failed to create backup context)"
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        return false;
      }
    }
    Lock::Lock(&lock,(Mutex *)&(anonymous_namespace)::mutex);
    if (this->m_multisample == true) {
      iVar3 = std::
              _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_int>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
              ::find(&(this->m_multisampleFrameBuffers)._M_t,&contextId);
      pmVar1 = &this->m_multisampleFrameBuffers;
    }
    else {
      iVar3 = std::
              _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_int>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
              ::find(&(this->m_frameBuffers)._M_t,&contextId);
      pmVar1 = &this->m_frameBuffers;
    }
    if ((_Rb_tree_header *)iVar3._M_node == &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) {
      Lock::~Lock(&lock);
      bVar2 = createFrameBuffer(this);
      return bVar2;
    }
    (*sf_glad_glBindFramebufferEXT)(0x8d40,*(GLuint *)&iVar3._M_node[1]._M_parent);
    Lock::~Lock(&lock);
  }
  return true;
}

Assistant:

bool RenderTextureImplFBO::activate(bool active)
{
    // Unbind the FBO if requested
    if (!active)
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
        return true;
    }

    Uint64 contextId = Context::getActiveContextId();

    // In the odd case we have to activate and there is no active
    // context yet, we have to create one
    if (!contextId)
    {
        if (!m_context)
            m_context = new Context;

        m_context->setActive(true);

        contextId = Context::getActiveContextId();

        if (!contextId)
        {
            err() << "Impossible to activate render texture (failed to create backup context)" << std::endl;

            return false;
        }
    }

    // Lookup the FBO corresponding to the currently active context
    // If none is found, there is no FBO corresponding to the
    // currently active context so we will have to create a new FBO
    {
        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter;
        
        if (m_multisample)
        {
            iter = m_multisampleFrameBuffers.find(contextId);

            if (iter != m_multisampleFrameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
        else
        {
            iter = m_frameBuffers.find(contextId);

            if (iter != m_frameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
    }

    return createFrameBuffer();
}